

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::MultipoleAdapter::makeMultipole
          (MultipoleAdapter *this,Vector3d *dipole,Mat3x3d *quadrupole,bool isDipole,
          bool isQuadrupole)

{
  bool bVar1;
  byte in_CL;
  MultipoleAtypeParameters *in_RDI;
  byte in_R8B;
  MultipoleAtypeParameters multipoleParam;
  string *in_stack_ffffffffffffff18;
  AtomType *in_stack_ffffffffffffff20;
  shared_ptr<OpenMD::GenericData> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>_> local_a8 [2];
  byte local_88;
  byte local_87;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff98;
  AtomType *in_stack_ffffffffffffffa0;
  
  bVar1 = isMultipole((MultipoleAdapter *)0x2c7ab1);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  local_88 = 0;
  local_87 = 0;
  Vector3<double>::Vector3((Vector3<double> *)0x2c7ae4);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x2c7af1);
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_ffffffffffffff20,
             (Vector3<double> *)in_stack_ffffffffffffff18);
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)in_stack_ffffffffffffff20,
             (SquareMatrix3<double> *)in_stack_ffffffffffffff18);
  this_00 = *(shared_ptr<OpenMD::GenericData> **)in_RDI;
  local_88 = in_CL & 1;
  local_87 = in_R8B & 1;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>,std::__cxx11::string_const&,OpenMD::MultipoleAtypeParameters&>
            (in_stack_ffffffffffffff48,in_RDI);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>,void>(this_00,local_a8);
  AtomType::addProperty(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2c7b84);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>_> *)0x2c7b8e);
  MultipoleAtypeParameters::~MultipoleAtypeParameters((MultipoleAtypeParameters *)0x2c7b98);
  return;
}

Assistant:

void MultipoleAdapter::makeMultipole(Vector3d dipole, Mat3x3d quadrupole,
                                       bool isDipole, bool isQuadrupole) {
    if (isMultipole()) { at_->removeProperty(MultipoleTypeID); }

    MultipoleAtypeParameters multipoleParam {};

    multipoleParam.dipole     = dipole;
    multipoleParam.quadrupole = quadrupole;

    multipoleParam.isDipole     = isDipole;
    multipoleParam.isQuadrupole = isQuadrupole;

    at_->addProperty(
        std::make_shared<MultipoleAtypeData>(MultipoleTypeID, multipoleParam));
  }